

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::enforceNotReservedTag(string *tag,SourceLineInfo *_lineInfo)

{
  bool bVar1;
  ulong in_RAX;
  ostream *poVar2;
  uint6 uStack_18;
  Colour colourGuard_1;
  Colour colourGuard;
  
  _uStack_18 = in_RAX;
  bVar1 = isReservedTag(tag);
  if (!bVar1) {
    return;
  }
  _uStack_18 = _uStack_18 & 0xffffffffffffff;
  Colour::use(Red);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Tag name [");
  poVar2 = std::operator<<(poVar2,(string *)tag);
  poVar2 = std::operator<<(poVar2,"] not allowed.\n");
  std::operator<<(poVar2,"Tag names starting with non alpha-numeric characters are reserved\n");
  Colour::~Colour(&colourGuard);
  _uStack_18 = (uint7)uStack_18;
  Colour::use(FileName);
  operator<<((ostream *)&std::cerr,_lineInfo);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  Colour::~Colour(&colourGuard_1);
  exit(1);
}

Assistant:

inline void enforceNotReservedTag( std::string const& tag, SourceLineInfo const& _lineInfo ) {
        if( isReservedTag( tag ) ) {
            {
                Colour colourGuard( Colour::Red );
                Catch::cerr()
                    << "Tag name [" << tag << "] not allowed.\n"
                    << "Tag names starting with non alpha-numeric characters are reserved\n";
            }
            {
                Colour colourGuard( Colour::FileName );
                Catch::cerr() << _lineInfo << std::endl;
            }
            exit(1);
        }
    }